

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr64.h
# Opt level: O1

int64_t __thiscall icu_63::UVector64::push(UVector64 *this,int64_t i,UErrorCode *status)

{
  int iVar1;
  UBool UVar2;
  
  iVar1 = this->count;
  if (((iVar1 < -1) || (this->capacity <= iVar1)) &&
     (UVar2 = expandCapacity(this,iVar1 + 1,status), UVar2 == '\0')) {
    return i;
  }
  iVar1 = this->count;
  this->elements[iVar1] = i;
  this->count = iVar1 + 1;
  return i;
}

Assistant:

inline int64_t UVector64::push(int64_t i, UErrorCode &status) {
    addElement(i, status);
    return i;
}